

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation_tests.cpp
# Opt level: O1

void __thiscall
txreconciliation_tests::IsPeerRegisteredTest::test_method(IsPeerRegisteredTest *this)

{
  bool bVar1;
  readonly_property<bool> rVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  TxReconciliationTracker tracker;
  check_type cVar6;
  char *pcVar5;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined4 local_160;
  ReconciliationRegisterResult local_15c;
  undefined1 local_158 [16];
  undefined1 *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  TxReconciliationTracker local_b8;
  undefined4 *local_b0;
  undefined **local_a8;
  element_type *local_a0;
  shared_count sStack_98;
  undefined4 **local_90;
  ReconciliationRegisterResult *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  lazy_ostream *local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  TxReconciliationTracker::TxReconciliationTracker(&local_b8,1);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x49;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  bVar1 = TxReconciliationTracker::IsPeerRegistered(&local_b8,0);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_158._0_8_ = "!tracker.IsPeerRegistered(peer_id0)";
  local_158._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_e0 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_158;
  local_a8._0_1_ = (class_property<bool>)(class_property<bool>)!bVar1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,2,0,WARN,_cVar6,(size_t)&local_e8,0x49);
  boost::detail::shared_count::~shared_count(&sStack_98);
  TxReconciliationTracker::PreRegisterPeer(&local_b8,0);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4b;
  file_00.m_begin = (iterator)&local_f8;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_108,
             msg_00);
  bVar1 = TxReconciliationTracker::IsPeerRegistered(&local_b8,0);
  local_a8 = (undefined **)CONCAT71(local_a8._1_7_,!bVar1);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_158._0_8_ = "!tracker.IsPeerRegistered(peer_id0)";
  local_158._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_110 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,2,0,WARN,_cVar6,(size_t)&local_118,0x4b);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4d;
  file_01.m_begin = (iterator)&local_128;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_138,
             msg_01);
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013abb30;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = "";
  local_15c = TxReconciliationTracker::RegisterPeer(&local_b8,0,true,1,1);
  local_88 = &local_15c;
  local_b0 = &local_160;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_15c == SUCCESS);
  local_160 = 1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_58 = "";
  local_68 = (lazy_ostream *)&local_88;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013b0eb0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_a8 = &PTR__lazy_ostream_013b0eb0;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar5 = "tracker.RegisterPeer(peer_id0, true, 1, 1)";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_158,2,2,REQUIRE,0xf68b42,(size_t)&local_60,0x4d,
             &local_80,"ReconciliationRegisterResult::SUCCESS",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4e;
  file_02.m_begin = (iterator)&local_170;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_180,
             msg_02);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)TxReconciliationTracker::IsPeerRegistered(&local_b8,0);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_158._0_8_ = "tracker.IsPeerRegistered(peer_id0)";
  local_158._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_188 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_158;
  local_a8._0_1_ = rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar5,(size_t)&local_190,
             0x4e);
  boost::detail::shared_count::~shared_count(&sStack_98);
  TxReconciliationTracker::ForgetPeer(&local_b8,0);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_1a0;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b0,
             msg_03);
  bVar1 = TxReconciliationTracker::IsPeerRegistered(&local_b8,0);
  local_a8 = (undefined **)CONCAT71(local_a8._1_7_,!bVar1);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_158._0_8_ = "!tracker.IsPeerRegistered(peer_id0)";
  local_158._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_1b8 = "";
  local_68 = (lazy_ostream *)local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar5,(size_t)&local_1c0,
             0x51);
  boost::detail::shared_count::~shared_count(&sStack_98);
  TxReconciliationTracker::~TxReconciliationTracker(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPeerRegisteredTest)
{
    TxReconciliationTracker tracker(TXRECONCILIATION_VERSION);
    NodeId peer_id0 = 0;

    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));
    tracker.PreRegisterPeer(peer_id0);
    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));

    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(peer_id0, true, 1, 1), ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(peer_id0));

    tracker.ForgetPeer(peer_id0);
    BOOST_CHECK(!tracker.IsPeerRegistered(peer_id0));
}